

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O2

long __thiscall Wasm::WasmBinaryReader::LEB128<long,33u>(WasmBinaryReader *this,uint32 *length)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  WasmBinaryReader *this_00;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  
  *length = 0;
  bVar2 = 0x80;
  bVar5 = 0;
  iVar4 = 0x40;
  uVar6 = 0;
  uVar7 = 0;
  this_00 = this;
  while ((uVar6 < 5 && ((char)bVar2 < '\0'))) {
    this_00 = this;
    CheckBytesLeft(this,1);
    pbVar1 = this->m_pc;
    this->m_pc = pbVar1 + 1;
    bVar2 = *pbVar1;
    uVar7 = uVar7 | (ulong)(bVar2 & 0x7f) << (bVar5 & 0x3f);
    bVar5 = bVar5 + 7;
    uVar6 = uVar6 + 1;
    iVar4 = iVar4 + -7;
  }
  if ((-1 < (char)bVar2) && (((uVar6 != 5 || ((bVar2 & 0x70) == 0)) || ((bVar2 & 0x70) == 0x70)))) {
    *length = uVar6;
    uVar3 = (long)(uVar7 << ((byte)iVar4 & 0x3f)) >> ((byte)iVar4 & 0x3f);
    if (iVar4 < 1) {
      uVar3 = uVar7;
    }
    return uVar3;
  }
  ThrowDecodingError(this_00,L"Invalid LEB128 format");
}

Assistant:

LEBType WasmBinaryReader::LEB128(uint32 &length)
{
    CompileAssert((sizeof(LEBType) * 8) >= bits);
    constexpr bool sign = LEBType(-1) < LEBType(0);
    LEBType result = 0;
    uint32 shift = 0;
    byte b = 0x80;
    length = 0;
    constexpr uint32 maxBytes = (uint32)((bits + 6) / 7);
    CompileAssert(maxBytes > 0);

    uint32 iByte = 0;
    for (; iByte < maxBytes && (b & 0x80) == 0x80; ++iByte)
    {
        CheckBytesLeft(1);
        b = *m_pc++;
        result = result | ((LEBType)(b & 0x7f) << shift);
        shift += 7;
    }

    if ((b & 0x80) == 0x80)
    {
        ThrowDecodingError(_u("Invalid LEB128 format"));
    }

    const bool isLastByte = iByte == maxBytes;
    constexpr bool hasExtraBits = (maxBytes * 7) != bits;
    if (hasExtraBits && isLastByte)
    {
        // A signed-LEB128 must sign-extend the final byte, excluding its most-significant bit
        // For unsigned values, the extra bits must be all zero.
        // For signed values, the extra bits *plus* the most significant bit must either be 0, or all ones.

        // e.g. for a 32-bit LEB128:
        //   bitsInLastByte = 4  (== 32 - (5-1) * 7)
        //     0bYYYXXXX where Y are extra bits and X are bits included in LEB128
        //   if signed: check if 0bYYYXXXX is 0b0000XXX or 0b1111XXX
        //   is unsigned: check if 0bYYYXXXX is 0b000XXXX

        constexpr int bitsInLastByte = bits - (maxBytes - 1) * 7;
        constexpr int lastBitToCheck = bitsInLastByte - (sign ? 1 : 0);
        constexpr byte signExtendedExtraBits = 0x7f & (0xFF << lastBitToCheck);
        const byte checkedBits = b & (0xFF << lastBitToCheck);
        bool validExtraBits =
            checkedBits == 0 ||
            (sign && checkedBits == signExtendedExtraBits);
        if (!validExtraBits)
        {
            ThrowDecodingError(_u("Invalid LEB128 format"));
        }
    }

    length = iByte;
    if (sign)
    {
        // Perform sign extension
        const int signExtendShift = (sizeof(LEBType) * 8) - shift;
        if (signExtendShift > 0)
        {
            result = static_cast<LEBType>(result << signExtendShift) >> signExtendShift;
        }
    }
    return result;
}